

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * google::protobuf::io::anon_unknown_1::CopyCordToArray(Cord *cord,uint8_t *target)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dd;
  ChunkIterator __begin3;
  ChunkIterator local_b8;
  
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  local_b8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_b8.bytes_remaining_ = 0;
  local_b8.current_chunk_ = (string_view)ZEXT816(0);
  local_b8.btree_reader_.remaining_ = 0;
  local_b8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  tree = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) == 0) {
      local_b8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
      local_b8.current_chunk_._M_str = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
      local_b8.current_chunk_._M_len = local_b8.bytes_remaining_;
      goto LAB_002deb9e;
    }
    _GLOBAL__N_1::CopyCordToArray();
    uVar5 = extraout_XMM0_Da;
    uVar6 = extraout_XMM0_Db;
    uVar7 = extraout_XMM0_Dc;
    uVar8 = extraout_XMM0_Dd;
  }
  else {
    local_b8.bytes_remaining_ = tree->length;
    if (local_b8.bytes_remaining_ != 0) {
      absl::lts_20250127::Cord::ChunkIterator::InitTree(&local_b8,tree);
      goto LAB_002deb9e;
    }
  }
  local_b8.current_chunk_._M_len._4_4_ = uVar6;
  local_b8.current_chunk_._M_len._0_4_ = uVar5;
  local_b8.current_chunk_._M_str._0_4_ = uVar7;
  local_b8.current_chunk_._M_str._4_4_ = uVar8;
LAB_002deb9e:
  if (local_b8.bytes_remaining_ != 0) {
    do {
      sVar3 = local_b8.bytes_remaining_;
      sVar2 = local_b8.current_chunk_._M_len;
      memcpy(target,local_b8.current_chunk_._M_str,local_b8.current_chunk_._M_len);
      target = target + sVar2;
      uVar4 = sVar3 - sVar2;
      if (sVar3 < sVar2) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      local_b8.bytes_remaining_ = uVar4;
      if (uVar4 != 0) {
        if (((long)local_b8.btree_reader_.navigator_.height_ < 0) ||
           (local_b8.btree_reader_.navigator_.node_[local_b8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (sVar2 == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x617,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_b8.current_chunk_ = (string_view)ZEXT816(0);
        }
        else {
          local_b8.current_chunk_ =
               absl::lts_20250127::cord_internal::CordRepBtreeReader::Next(&local_b8.btree_reader_);
        }
      }
    } while (local_b8.bytes_remaining_ != 0);
  }
  return target;
}

Assistant:

inline uint8_t* CopyCordToArray(const absl::Cord& cord, uint8_t* target) {
  for (absl::string_view sv : cord.Chunks()) {
    memcpy(target, sv.data(), sv.size());
    target += sv.size();
  }
  return target;
}